

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O1

void * FIX::ThreadedSocketInitiator::socketThread(void *p)

{
  socket_handle s;
  ThreadedSocketInitiator *this;
  ThreadedSocketConnection *this_00;
  NullLog *pNVar1;
  int iVar2;
  Session *this_01;
  ssize_t sVar3;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  sockaddr *__addr;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  long **pplVar4;
  NullLog *pNVar5;
  SessionID sessionID;
  long *local_1b8 [2];
  long local_1a8 [2];
  SessionID local_198;
  
  pplVar4 = local_1b8;
  this = *p;
  this_00 = *(ThreadedSocketConnection **)((long)p + 8);
  SessionID::SessionID(&local_198,&this_00->m_pSession->m_sessionID);
  this_01 = Session::lookupSession(&local_198);
  s = this_00->m_socket;
  iVar2 = 0x10;
  operator_delete(p,0x10);
  lock(this);
  iVar2 = ThreadedSocketConnection::connect(this_00,iVar2,__addr,in_ECX);
  if ((char)iVar2 == '\0') {
    pNVar1 = (NullLog *)(this->super_Initiator).m_pLog;
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Connection failed","");
    pNVar5 = &(this->super_Initiator).m_nullLog;
    if (pNVar1 != (NullLog *)0x0) {
      pNVar5 = pNVar1;
    }
    (*(pNVar5->super_Log)._vptr_Log[6])(pNVar5,local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    (*(this_00->super_Responder)._vptr_Responder[3])(this_00);
    (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
  }
  else {
    Initiator::setConnected(&this->super_Initiator,&local_198);
    pNVar1 = (NullLog *)(this->super_Initiator).m_pLog;
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Connection succeeded","");
    pNVar5 = &(this->super_Initiator).m_nullLog;
    if (pNVar1 != (NullLog *)0x0) {
      pNVar5 = pNVar1;
    }
    (*(pNVar5->super_Log)._vptr_Log[6])();
    if (local_1b8[0] != local_1a8) {
      pplVar4 = (long **)(local_1a8[0] + 1);
      operator_delete(local_1b8[0],(ulong)pplVar4);
    }
    Session::next(this_01);
    __buf = extraout_RDX;
    do {
      sVar3 = ThreadedSocketConnection::read
                        (this_00,(int)pplVar4,__buf,CONCAT44(in_register_0000000c,in_ECX));
      __buf = extraout_RDX_00;
    } while ((char)sVar3 != '\0');
    (*(this_00->super_Responder)._vptr_Responder[1])(this_00);
    if ((this->super_Initiator).m_stop != false) goto LAB_001bc1ab;
  }
  removeThread(this,s);
LAB_001bc1ab:
  Initiator::setDisconnected(&this->super_Initiator,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_frozenString._M_dataplus._M_p != &local_198.m_frozenString.field_2) {
    operator_delete(local_198.m_frozenString._M_dataplus._M_p,
                    local_198.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.m_sessionQualifier._M_dataplus._M_p != &local_198.m_sessionQualifier.field_2) {
    operator_delete(local_198.m_sessionQualifier._M_dataplus._M_p,
                    local_198.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FieldBase::~FieldBase((FieldBase *)&local_198.m_targetCompID);
  FieldBase::~FieldBase((FieldBase *)&local_198.m_senderCompID);
  FieldBase::~FieldBase((FieldBase *)&local_198);
  return (void *)0x0;
}

Assistant:

THREAD_PROC ThreadedSocketInitiator::socketThread( void* p )
{
  ThreadPair * pair = reinterpret_cast < ThreadPair* > ( p );

  ThreadedSocketInitiator* pInitiator = pair->first;
  ThreadedSocketConnection* pConnection = pair->second;
  FIX::SessionID sessionID = pConnection->getSession()->getSessionID();
  FIX::Session* pSession = FIX::Session::lookupSession( sessionID );
  socket_handle socket = pConnection->getSocket();
  delete pair;

  pInitiator->lock();

  if( !pConnection->connect() )
  {
    pInitiator->getLog()->onEvent( "Connection failed" );
    pConnection->disconnect();
    delete pConnection;
    pInitiator->removeThread( socket );
    pInitiator->setDisconnected( sessionID );
    return 0;
  }

  pInitiator->setConnected( sessionID );
  pInitiator->getLog()->onEvent( "Connection succeeded" );

  pSession->next();

  while ( pConnection->read() ) {}

  delete pConnection;
  if( !pInitiator->isStopped() )
    pInitiator->removeThread( socket );
  
  pInitiator->setDisconnected( sessionID );
  return 0;
}